

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O0

LogTest * __thiscall leveldb::log::LogTest::Read_abi_cxx11_(LogTest *this)

{
  bool bVar1;
  long in_RSI;
  allocator local_69;
  undefined4 local_68;
  undefined1 local_58 [8];
  Slice record;
  string scratch;
  Slice local_28;
  LogTest *this_local;
  
  this_local = this;
  if ((*(byte *)(in_RSI + 0x78) & 1) == 0) {
    *(undefined1 *)(in_RSI + 0x78) = 1;
    Slice::Slice(&local_28,(string *)(in_RSI + 8));
    *(char **)(in_RSI + 0x30) = local_28.data_;
    *(size_t *)(in_RSI + 0x38) = local_28.size_;
  }
  std::__cxx11::string::string((string *)&record.size_);
  Slice::Slice((Slice *)local_58);
  bVar1 = Reader::ReadRecord(*(Reader **)(in_RSI + 0x88),(Slice *)local_58,(string *)&record.size_);
  if (bVar1) {
    Slice::ToString_abi_cxx11_((Slice *)this);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"EOF",&local_69);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
  }
  local_68 = 1;
  std::__cxx11::string::~string((string *)&record.size_);
  return this;
}

Assistant:

std::string Read() {
    if (!reading_) {
      reading_ = true;
      source_.contents_ = Slice(dest_.contents_);
    }
    std::string scratch;
    Slice record;
    if (reader_->ReadRecord(&record, &scratch)) {
      return record.ToString();
    } else {
      return "EOF";
    }
  }